

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

predictor * __thiscall
Search::predictor::set_input(predictor *this,example *input_example,size_t input_length)

{
  size_t in_RDX;
  example *in_RSI;
  predictor *in_RDI;
  
  free_ec(in_RDI);
  in_RDI->is_ldf = true;
  in_RDI->ec = in_RSI;
  in_RDI->ec_cnt = in_RDX;
  in_RDI->ec_alloced = false;
  return in_RDI;
}

Assistant:

predictor& predictor::set_input(example* input_example, size_t input_length)
{
  free_ec();
  is_ldf = true;
  ec = input_example;
  ec_cnt = input_length;
  ec_alloced = false;
  return *this;
}